

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O3

uint Extra_TruthCanonP(uint uTruth,int nVars)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar19;
  uint uVar20;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  
  if (Extra_TruthCanonP::pPerms == (char **)0x0) {
    if (0 < nVars) {
      auVar16 = _DAT_009cc170;
      iVar2 = 4;
      uVar6 = 1;
      uVar1 = 1;
      uVar9 = 1;
      uVar10 = 1;
      do {
        uVar14 = uVar10;
        uVar13 = uVar9;
        uVar12 = uVar1;
        uVar11 = uVar6;
        uVar6 = auVar16._0_4_ * uVar11;
        uVar9 = (uint)((auVar16._8_8_ & 0xffffffff) * (ulong)uVar13);
        uVar1 = auVar16._4_4_ * uVar12;
        uVar10 = auVar16._12_4_ * uVar14;
        auVar18._0_4_ = auVar16._0_4_ + 4;
        auVar18._4_4_ = auVar16._4_4_ + 4;
        auVar18._8_4_ = auVar16._8_4_ + 4;
        auVar18._12_4_ = auVar16._12_4_ + 4;
        iVar3 = iVar2 + -4;
        iVar5 = iVar2 + (nVars + 3U & 0xfffffffc);
        auVar16 = auVar18;
        iVar2 = iVar3;
      } while (iVar5 != 8);
      goto LAB_0048b52c;
    }
LAB_0048b580:
    Extra_TruthCanonP::nPerms = 1;
  }
  else {
    if (Extra_TruthCanonP::nVarsOld == nVars) goto LAB_0048b59f;
    free(Extra_TruthCanonP::pPerms);
    Extra_TruthCanonP::pPerms = (char **)0x0;
    if (nVars < 1) goto LAB_0048b580;
    auVar16 = _DAT_009cc170;
    iVar2 = 4;
    uVar6 = 1;
    uVar1 = 1;
    uVar9 = 1;
    uVar10 = 1;
    do {
      uVar14 = uVar10;
      uVar13 = uVar9;
      uVar12 = uVar1;
      uVar11 = uVar6;
      uVar6 = auVar16._0_4_ * uVar11;
      uVar9 = (uint)((auVar16._8_8_ & 0xffffffff) * (ulong)uVar13);
      uVar1 = auVar16._4_4_ * uVar12;
      uVar10 = auVar16._12_4_ * uVar14;
      auVar17._0_4_ = auVar16._0_4_ + 4;
      auVar17._4_4_ = auVar16._4_4_ + 4;
      auVar17._8_4_ = auVar16._8_4_ + 4;
      auVar17._12_4_ = auVar16._12_4_ + 4;
      iVar3 = iVar2 + -4;
      iVar5 = iVar2 + (nVars + 3U & 0xfffffffc);
      auVar16 = auVar17;
      iVar2 = iVar3;
    } while (iVar5 != 8);
LAB_0048b52c:
    uVar8 = nVars - 1;
    uVar4 = -iVar3;
    uVar15 = -(uint)((int)(uVar8 ^ 0x80000000) < (int)(uVar4 ^ 0x80000000));
    uVar19 = -(uint)((int)(nVars - 1U ^ 0x80000000) < (int)((uVar4 | 1) ^ 0x80000000));
    uVar20 = -(uint)((int)(uVar8 ^ 0x80000000) < (int)((uVar4 | 2) ^ 0x80000000));
    uVar4 = -(uint)((int)(uVar8 ^ 0x80000000) < (int)((uVar4 | 3) ^ 0x80000000));
    Extra_TruthCanonP::nPerms =
         (~uVar20 & uVar9 | uVar13 & uVar20) * (~uVar15 & uVar6 | uVar11 & uVar15) *
         (~uVar19 & uVar1 | uVar12 & uVar19) * (~uVar4 & uVar10 | uVar14 & uVar4);
  }
  Extra_TruthCanonP::pPerms = Extra_Permutations(nVars);
  Extra_TruthCanonP::nVarsOld = nVars;
LAB_0048b59f:
  if (Extra_TruthCanonP::nPerms < 1) {
    uVar6 = 0xffffffff;
  }
  else {
    uVar6 = 0xffffffff;
    lVar7 = 0;
    do {
      uVar1 = Extra_TruthPermute(uTruth,Extra_TruthCanonP::pPerms[lVar7],nVars,0);
      if (uVar1 <= uVar6) {
        uVar6 = uVar1;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < Extra_TruthCanonP::nPerms);
  }
  return uVar6;
}

Assistant:

unsigned Extra_TruthCanonP( unsigned uTruth, int nVars )
{
    static int nVarsOld, nPerms;
    static char ** pPerms = NULL;

    unsigned uTruthMin, uPerm;
    int k;

    if ( pPerms == NULL )
    {
        nPerms = Extra_Factorial( nVars );   
        pPerms = Extra_Permutations( nVars );
        nVarsOld = nVars;
    }
    else if ( nVarsOld != nVars )
    {
        ABC_FREE( pPerms );
        nPerms = Extra_Factorial( nVars );   
        pPerms = Extra_Permutations( nVars );
        nVarsOld = nVars;
    }

    uTruthMin = 0xFFFFFFFF;
    for ( k = 0; k < nPerms; k++ )
    {
        uPerm = Extra_TruthPermute( uTruth, pPerms[k], nVars, 0 );
        if ( uTruthMin > uPerm )
            uTruthMin = uPerm;
    }
    return uTruthMin;
}